

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

char * form_bit_name(long *form_flags)

{
  ulong uVar1;
  char *pcVar2;
  ulong *in_RDI;
  __type_conflict2 _Var3;
  
  form_bit_name::buf[0] = '\0';
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fea38);
  if ((uVar1 & (long)_Var3) == 0) {
    uVar1 = *in_RDI;
    _Var3 = std::pow<int,int>(0,0x5fea82);
    if ((uVar1 & (long)_Var3) != 0) {
      strcat(form_bit_name::buf," edible");
    }
  }
  else {
    strcat(form_bit_name::buf," poison");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5feacc);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," magical");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5feb17);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," instant_rot");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5feb62);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," other");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5febad);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," animal");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5febf8);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," sentient");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fec43);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," undead");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fec8e);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," construct");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fecd9);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," mist");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fed21);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," intangible");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fed66);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," biped");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fedab);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," aquatic");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fedf0);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," insect");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fee35);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," spider");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fee7a);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," crustacean");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5feebf);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," worm");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fef04);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," blob");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fef49);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," mammal");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fef8e);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," bird");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fefd3);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," reptile");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ff018);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," snake");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ff05d);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," dragon");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ff0a2);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," amphibian");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ff0e7);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," fish");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5ff12b);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(form_bit_name::buf," cold_blooded");
  }
  pcVar2 = " none";
  if (form_bit_name::buf[0] != '\0') {
    pcVar2 = form_bit_name::buf;
  }
  return pcVar2 + 1;
}

Assistant:

char *form_bit_name(long form_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(form_flags, FORM_POISON))
		strcat(buf, " poison");
	else if (IS_SET(form_flags, FORM_EDIBLE))
		strcat(buf, " edible");

	if (IS_SET(form_flags, FORM_MAGICAL))
		strcat(buf, " magical");

	if (IS_SET(form_flags, FORM_INSTANT_DECAY))
		strcat(buf, " instant_rot");

	if (IS_SET(form_flags, FORM_OTHER))
		strcat(buf, " other");

	if (IS_SET(form_flags, FORM_ANIMAL))
		strcat(buf, " animal");

	if (IS_SET(form_flags, FORM_SENTIENT))
		strcat(buf, " sentient");

	if (IS_SET(form_flags, FORM_UNDEAD))
		strcat(buf, " undead");

	if (IS_SET(form_flags, FORM_CONSTRUCT))
		strcat(buf, " construct");

	if (IS_SET(form_flags, FORM_MIST))
		strcat(buf, " mist");

	if (IS_SET(form_flags, FORM_INTANGIBLE))
		strcat(buf, " intangible");

	if (IS_SET(form_flags, FORM_BIPED))
		strcat(buf, " biped");

	if (IS_SET(form_flags, FORM_AQUATIC))
		strcat(buf, " aquatic");

	if (IS_SET(form_flags, FORM_INSECT))
		strcat(buf, " insect");

	if (IS_SET(form_flags, FORM_SPIDER))
		strcat(buf, " spider");

	if (IS_SET(form_flags, FORM_CRUSTACEAN))
		strcat(buf, " crustacean");

	if (IS_SET(form_flags, FORM_WORM))
		strcat(buf, " worm");

	if (IS_SET(form_flags, FORM_BLOB))
		strcat(buf, " blob");

	if (IS_SET(form_flags, FORM_MAMMAL))
		strcat(buf, " mammal");

	if (IS_SET(form_flags, FORM_BIRD))
		strcat(buf, " bird");

	if (IS_SET(form_flags, FORM_REPTILE))
		strcat(buf, " reptile");

	if (IS_SET(form_flags, FORM_SNAKE))
		strcat(buf, " snake");

	if (IS_SET(form_flags, FORM_DRAGON))
		strcat(buf, " dragon");

	if (IS_SET(form_flags, FORM_AMPHIBIAN))
		strcat(buf, " amphibian");

	if (IS_SET(form_flags, FORM_FISH))
		strcat(buf, " fish");

	if (IS_SET(form_flags, FORM_COLD_BLOOD))
		strcat(buf, " cold_blooded");

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}